

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

void __thiscall ncnn::Deconvolution::Deconvolution(Deconvolution *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffff70;
  
  Layer::Layer(in_stack_ffffffffffffff70);
  *in_RDI = &PTR__Deconvolution_01f8ddd0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  *(undefined4 *)(in_RDI + 0x26) = 0;
  in_RDI[0x27] = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)((long)in_RDI + 0x144) = 0;
  *(undefined4 *)(in_RDI + 0x29) = 0;
  *(undefined4 *)((long)in_RDI + 0x14c) = 0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  *(undefined4 *)(in_RDI + 0x2f) = 0;
  in_RDI[0x30] = 0;
  *(undefined4 *)(in_RDI + 0x31) = 0;
  *(undefined4 *)((long)in_RDI + 0x18c) = 0;
  *(undefined4 *)(in_RDI + 0x32) = 0;
  *(undefined4 *)((long)in_RDI + 0x194) = 0;
  *(undefined4 *)(in_RDI + 0x33) = 0;
  in_RDI[0x34] = 0;
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  in_RDI[0x37] = 0;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  in_RDI[0x39] = 0;
  *(undefined4 *)(in_RDI + 0x3a) = 0;
  *(undefined4 *)((long)in_RDI + 0x1d4) = 0;
  *(undefined4 *)(in_RDI + 0x3b) = 0;
  *(undefined4 *)((long)in_RDI + 0x1dc) = 0;
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  in_RDI[0x3d] = 0;
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

Deconvolution::Deconvolution()
{
    one_blob_only = true;
    support_inplace = false;
}